

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool google::protobuf::anon_unknown_0::IsIndexInHasBitSet(uint32 *has_bit_set,uint32 has_bit_index)

{
  uint in_ESI;
  long in_RDI;
  
  return (*(uint *)(in_RDI + (ulong)(in_ESI >> 5) * 4) >> ((byte)in_ESI & 0x1f) & 1) != 0;
}

Assistant:

bool IsIndexInHasBitSet(const uint32* has_bit_set, uint32 has_bit_index) {
  GOOGLE_DCHECK_NE(has_bit_index, ~0u);
  return ((has_bit_set[has_bit_index / 32] >> (has_bit_index % 32)) &
          static_cast<uint32>(1)) != 0;
}